

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Detonation_PDU::Detonation_PDU(Detonation_PDU *this,KDataStream *stream)

{
  KDataStream *stream_local;
  Detonation_PDU *this_local;
  
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Detonation_PDU_0032fc80;
  DATA_TYPE::Vector::Vector(&this->m_Velocity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_LocationWorldCoords);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&this->m_pDescriptor);
  DATA_TYPE::Vector::Vector(&this->m_LocationEntityCoords);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::vector(&this->m_vVariableParameters);
  (*(this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Detonation_PDU::Detonation_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}